

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

optional<pbrt::LightLiSample> * __thiscall
pbrt::UniformInfiniteLight::SampleLi
          (UniformInfiniteLight *this,LightSampleContext ctx,Point2f u,SampledWavelengths lambda,
          bool allowIncompletePDF)

{
  undefined8 uVar1;
  Point2f u_00;
  byte in_DL;
  DenselySampledSpectrum *in_RSI;
  optional<pbrt::LightLiSample> *in_RDI;
  Float FVar2;
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar8 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  SampledSpectrum SVar13;
  Vector3f VVar14;
  Point3f PVar15;
  Vector3<float> VVar16;
  Point3<float> PVar17;
  Float pdf;
  Vector3f wi;
  int iVar18;
  undefined4 in_stack_fffffffffffffe0c;
  optional<pbrt::LightLiSample> *poVar19;
  LightLiSample *this_00;
  SampledWavelengths *lambda_00;
  float in_stack_fffffffffffffe38;
  float in_stack_fffffffffffffe44;
  float in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined1 auVar3 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar12 [56];
  
  auVar12 = in_ZMM1._8_56_;
  this_00 = (LightLiSample *)&stack0x00000038;
  lambda_00 = (SampledWavelengths *)&stack0x00000008;
  vmovlpd_avx(in_ZMM0._0_16_);
  poVar19 = in_RDI;
  if ((in_DL & 1) == 0) {
    auVar9 = ZEXT856(0);
    u_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffe48;
    u_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffe44;
    VVar14 = SampleUniformSphere(u_00);
    auVar3._0_8_ = VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar3._8_56_ = auVar9;
    uVar1 = vmovlpd_avx(auVar3._0_16_);
    FVar2 = UniformSpherePDF();
    iVar18 = in_RSI[4].lambda_min;
    auVar9 = (undefined1  [56])0x0;
    SVar13 = DenselySampledSpectrum::Sample(in_RSI,lambda_00);
    auVar10._0_8_ = SVar13.values.values._8_8_;
    auVar10._8_56_ = auVar12;
    auVar4._0_8_ = SVar13.values.values._0_8_;
    auVar4._8_56_ = auVar9;
    auVar9 = (undefined1  [56])0x0;
    vmovlpd_avx(auVar4._0_16_);
    vmovlpd_avx(auVar10._0_16_);
    SVar13 = pbrt::operator*((Float)((ulong)in_RDI >> 0x20),
                             (SampledSpectrum *)CONCAT44(in_stack_fffffffffffffe0c,iVar18));
    auVar11._0_8_ = SVar13.values.values._8_8_;
    auVar11._8_56_ = auVar12;
    auVar5._0_8_ = SVar13.values.values._0_8_;
    auVar5._8_56_ = auVar9;
    vmovlpd_avx(auVar5._0_16_);
    vmovlpd_avx(auVar11._0_16_);
    auVar12 = (undefined1  [56])0x0;
    PVar15 = LightSampleContext::p
                       ((LightSampleContext *)
                        CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    auVar6._0_8_ = PVar15.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar6._8_56_ = auVar12;
    vmovlpd_avx(auVar6._0_16_);
    auVar12 = (undefined1  [56])0x0;
    VVar16 = Tuple3<pbrt::Vector3,float>::operator*
                       ((Tuple3<pbrt::Vector3,_float> *)this_00,(float)((ulong)poVar19 >> 0x20));
    auVar7._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar7._8_56_ = auVar12;
    vmovlpd_avx(auVar7._0_16_);
    auVar12 = ZEXT856(0);
    VVar16.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffe38;
    VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_RSI;
    PVar17 = Point3<float>::operator+((Point3<float> *)poVar19,VVar16);
    auVar8._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar8._8_56_ = auVar12;
    vmovlpd_avx(auVar8._0_16_);
    PVar15.super_Tuple3<pbrt::Point3,_float>._4_8_ = in_RSI;
    PVar15.super_Tuple3<pbrt::Point3,_float>.x = (float)((ulong)lambda_00 >> 0x20);
    Interaction::Interaction((Interaction *)in_RDI,PVar15,(MediumInterface *)CONCAT44(FVar2,iVar18))
    ;
    VVar14.super_Tuple3<pbrt::Vector3,_float>.y = VVar14.super_Tuple3<pbrt::Vector3,_float>.z;
    VVar14.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)((ulong)uVar1 >> 0x20);
    VVar14.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffe44;
    LightLiSample::LightLiSample
              (this_00,(SampledSpectrum *)poVar19,VVar14,(Float)((ulong)in_RDI >> 0x20),
               (Interaction *)CONCAT44(FVar2,iVar18));
    pstd::optional<pbrt::LightLiSample>::optional(in_RDI,(LightLiSample *)CONCAT44(FVar2,iVar18));
  }
  else {
    memset(in_RDI,0,0x78);
    pstd::optional<pbrt::LightLiSample>::optional(in_RDI);
  }
  return poVar19;
}

Assistant:

PBRT_CPU_GPU pstd::optional<LightLiSample> UniformInfiniteLight::SampleLi(
    LightSampleContext ctx, Point2f u, SampledWavelengths lambda,
    bool allowIncompletePDF) const {
    if (allowIncompletePDF)
        return {};
    // Return uniform spherical sample for uniform infinite light
    Vector3f wi = SampleUniformSphere(u);
    Float pdf = UniformSpherePDF();
    return LightLiSample(scale * Lemit->Sample(lambda), wi, pdf,
                         Interaction(ctx.p() + wi * (2 * sceneRadius), &mediumInterface));
}